

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrs.cpp
# Opt level: O2

void __thiscall
icu_63::NFRuleSet::format
          (NFRuleSet *this,double number,UnicodeString *toAppendTo,int32_t pos,
          int32_t recursionCount,UErrorCode *status)

{
  NFRule *this_00;
  
  if (recursionCount < 0x40) {
    this_00 = findDoubleRule(this,number);
    if (this_00 != (NFRule *)0x0) {
      NFRule::doFormat(this_00,number,toAppendTo,pos,recursionCount + 1,status);
      return;
    }
  }
  else {
    *status = U_INVALID_STATE_ERROR;
  }
  return;
}

Assistant:

void
NFRuleSet::format(double number, UnicodeString& toAppendTo, int32_t pos, int32_t recursionCount, UErrorCode& status) const
{
    if (recursionCount >= RECURSION_LIMIT) {
        // stop recursion
        status = U_INVALID_STATE_ERROR;
        return;
    }
    const NFRule *rule = findDoubleRule(number);
    if (rule) { // else error, but can't report it
        rule->doFormat(number, toAppendTo, pos, ++recursionCount, status);
    }
}